

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O2

void __thiscall Test::Test(Test *this,char *description,Body *body)

{
  Registry *this_00;
  Test *local_18;
  
  this->description = description;
  std::function<bool_()>::function(&this->body,body);
  this_00 = Registry::getInstance();
  local_18 = this;
  std::__cxx11::list<Test_*,_std::allocator<Test_*>_>::push_back(&this_00->tests,&local_18);
  return;
}

Assistant:

Test::Test(const char *description, Body body)
	: description(description), body(body)
{
	Registry::getInstance().tests.push_back(this);
}